

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  int iVar1;
  texture_type_t tVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char **token_00;
  bool bVar6;
  real_t rVar7;
  allocator local_b1;
  string local_b0 [32];
  string local_90;
  char *local_70;
  char *end;
  char *local_58;
  char *token;
  string texture_name;
  bool found_texname;
  char *linebuf_local;
  texture_option_t *texopt_local;
  string *texname_local;
  
  texture_name.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)&token);
  pcVar4 = linebuf;
  while( true ) {
    local_58 = pcVar4;
    bVar6 = true;
    if ((*local_58 != '\r') && (bVar6 = true, *local_58 != '\n')) {
      bVar6 = *local_58 == '\0';
    }
    if (bVar6) break;
    sVar3 = strspn(local_58," \t");
    local_58 = local_58 + sVar3;
    iVar1 = strncmp(local_58,"-blendu",7);
    if ((iVar1 == 0) && ((local_58[7] == ' ' || (local_58[7] == '\t')))) {
      local_58 = local_58 + 8;
      bVar6 = parseOnOff(&local_58,true);
      texopt->blendu = bVar6;
      pcVar4 = local_58;
    }
    else {
      iVar1 = strncmp(local_58,"-blendv",7);
      if ((iVar1 == 0) && ((local_58[7] == ' ' || (local_58[7] == '\t')))) {
        local_58 = local_58 + 8;
        bVar6 = parseOnOff(&local_58,true);
        texopt->blendv = bVar6;
        pcVar4 = local_58;
      }
      else {
        iVar1 = strncmp(local_58,"-clamp",6);
        if ((iVar1 == 0) && ((local_58[6] == ' ' || (local_58[6] == '\t')))) {
          local_58 = local_58 + 7;
          bVar6 = parseOnOff(&local_58,true);
          texopt->clamp = bVar6;
          pcVar4 = local_58;
        }
        else {
          iVar1 = strncmp(local_58,"-boost",6);
          if ((iVar1 == 0) && ((local_58[6] == ' ' || (local_58[6] == '\t')))) {
            local_58 = local_58 + 7;
            rVar7 = parseReal(&local_58,1.0);
            texopt->sharpness = rVar7;
            pcVar4 = local_58;
          }
          else {
            iVar1 = strncmp(local_58,"-bm",3);
            if ((iVar1 == 0) && ((local_58[3] == ' ' || (local_58[3] == '\t')))) {
              local_58 = local_58 + 4;
              rVar7 = parseReal(&local_58,1.0);
              texopt->bump_multiplier = rVar7;
              pcVar4 = local_58;
            }
            else {
              iVar1 = strncmp(local_58,"-o",2);
              if ((iVar1 == 0) && ((local_58[2] == ' ' || (local_58[2] == '\t')))) {
                local_58 = local_58 + 3;
                parseReal3(texopt->origin_offset,texopt->origin_offset + 1,texopt->origin_offset + 2
                           ,&local_58,0.0,0.0,0.0);
                pcVar4 = local_58;
              }
              else {
                iVar1 = strncmp(local_58,"-s",2);
                if ((iVar1 == 0) && ((local_58[2] == ' ' || (local_58[2] == '\t')))) {
                  local_58 = local_58 + 3;
                  parseReal3(texopt->scale,texopt->scale + 1,texopt->scale + 2,&local_58,1.0,1.0,1.0
                            );
                  pcVar4 = local_58;
                }
                else {
                  iVar1 = strncmp(local_58,"-t",2);
                  if ((iVar1 == 0) && ((local_58[2] == ' ' || (local_58[2] == '\t')))) {
                    local_58 = local_58 + 3;
                    parseReal3(texopt->turbulence,texopt->turbulence + 1,texopt->turbulence + 2,
                               &local_58,0.0,0.0,0.0);
                    pcVar4 = local_58;
                  }
                  else {
                    iVar1 = strncmp(local_58,"-type",5);
                    if ((iVar1 == 0) && ((local_58[5] == ' ' || (local_58[5] == '\t')))) {
                      local_58 = local_58 + 5;
                      tVar2 = parseTextureType(&local_58,TEXTURE_TYPE_NONE);
                      texopt->type = tVar2;
                      pcVar4 = local_58;
                    }
                    else {
                      iVar1 = strncmp(local_58,"-texres",7);
                      if ((iVar1 == 0) && ((local_58[7] == ' ' || (local_58[7] == '\t')))) {
                        local_58 = local_58 + 7;
                        iVar1 = parseInt(&local_58);
                        texopt->texture_resolution = iVar1;
                        pcVar4 = local_58;
                      }
                      else {
                        iVar1 = strncmp(local_58,"-imfchan",8);
                        if ((iVar1 == 0) && ((local_58[8] == ' ' || (local_58[8] == '\t')))) {
                          local_58 = local_58 + 9;
                          sVar3 = strspn(local_58," \t");
                          pcVar4 = local_58 + sVar3;
                          local_58 = pcVar4;
                          sVar3 = strcspn(pcVar4," \t\r");
                          local_70 = pcVar4 + sVar3;
                          pcVar4 = local_70;
                          if ((long)local_70 - (long)local_58 == 1) {
                            texopt->imfchan = *local_58;
                            pcVar4 = local_70;
                          }
                        }
                        else {
                          iVar1 = strncmp(local_58,"-mm",3);
                          if ((iVar1 == 0) && ((local_58[3] == ' ' || (local_58[3] == '\t')))) {
                            local_58 = local_58 + 4;
                            parseReal2(&texopt->brightness,&texopt->contrast,&local_58,0.0,1.0);
                            pcVar4 = local_58;
                          }
                          else {
                            iVar1 = strncmp(local_58,"-colorspace",0xb);
                            pcVar4 = local_58;
                            if ((iVar1 == 0) && ((local_58[0xb] == ' ' || (local_58[0xb] == '\t'))))
                            {
                              local_58 = local_58 + 0xc;
                              parseString_abi_cxx11_(&local_90,(tinyobj *)&local_58,token_00);
                              std::__cxx11::string::operator=
                                        ((string *)&texopt->colorspace,(string *)&local_90);
                              std::__cxx11::string::~string((string *)&local_90);
                              pcVar4 = local_58;
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_b0,pcVar4,&local_b1);
                              std::__cxx11::string::operator=((string *)&token,local_b0);
                              std::__cxx11::string::~string(local_b0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_b1);
                              lVar5 = std::__cxx11::string::length();
                              texture_name.field_2._M_local_buf[0xf] = '\x01';
                              pcVar4 = local_58 + lVar5;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar6 = (texture_name.field_2._M_local_buf[0xf] & 1U) != 0;
  if (bVar6) {
    std::__cxx11::string::operator=((string *)texname,(string *)&token);
  }
  std::__cxx11::string::~string((string *)&token);
  return bVar6;
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-texres", 7)) && IS_SPACE((token[7]))) {
      token += 7;
      // TODO(syoyo): Check if arg is int type.
      texopt->texture_resolution = parseInt(&token);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}